

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O1

void vkt::api::anon_unknown_0::createImageFormatTypeTests
               (TestCaseGroup *testGroup,ImageFormatPropertyCase params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestContext *pTVar3;
  ImageFormatPropertyCase arg0;
  ImageFormatPropertyCase arg0_00;
  TestNode *pTVar4;
  string local_a0;
  string local_80;
  Function local_60;
  undefined4 uStack_58;
  VkImageType VStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  Function local_48;
  undefined4 uStack_40;
  VkImageType VStack_3c;
  undefined4 local_38;
  uint uStack_34;
  
  pTVar3 = (testGroup->super_TestNode).m_testCtx;
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"optimal","");
  paVar2 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  local_48 = params.testFunction;
  uStack_40 = 0;
  VStack_3c = params.imageType;
  local_38 = 0;
  arg0.format = (int)((ulong)params.imageType << 0x20);
  arg0.imageType = (int)(((ulong)params.imageType << 0x20) >> 0x20);
  arg0.testFunction = params.testFunction;
  arg0._16_8_ = (ulong)uStack_34 << 0x20;
  pTVar4 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar3,&local_80,&local_a0,createImageFormatTypeTilingTests,arg0)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = (testGroup->super_TestNode).m_testCtx;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"linear","");
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  local_60 = params.testFunction;
  uStack_58 = 0;
  VStack_54 = params.imageType;
  local_50 = 1;
  arg0_00._20_4_ = uStack_4c;
  arg0_00.tiling = 1;
  arg0_00.format = (int)((ulong)params.imageType << 0x20);
  arg0_00.imageType = (int)(((ulong)params.imageType << 0x20) >> 0x20);
  arg0_00.testFunction = params.testFunction;
  pTVar4 = &createTestGroup<vkt::api::(anonymous_namespace)::ImageFormatPropertyCase>
                      (pTVar3,&local_80,&local_a0,createImageFormatTypeTilingTests,arg0_00)->
            super_TestNode;
  tcu::TestNode::addChild(&testGroup->super_TestNode,pTVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void createImageFormatTypeTests (tcu::TestCaseGroup* testGroup, ImageFormatPropertyCase params)
{
	DE_ASSERT(params.tiling == VK_IMAGE_TILING_LAST);

	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "optimal",	"",	createImageFormatTypeTilingTests, ImageFormatPropertyCase(params.testFunction, VK_FORMAT_UNDEFINED, params.imageType, VK_IMAGE_TILING_OPTIMAL)));
	testGroup->addChild(createTestGroup(testGroup->getTestContext(), "linear",	"",	createImageFormatTypeTilingTests, ImageFormatPropertyCase(params.testFunction, VK_FORMAT_UNDEFINED, params.imageType, VK_IMAGE_TILING_LINEAR)));
}